

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O3

SubprocessResult *
phosg::run_process(SubprocessResult *__return_storage_ptr__,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *cmd,string *stdin_data,bool check,string *cwd,
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *env,size_t timeout_usecs)

{
  int iVar1;
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type sVar3;
  _Hash_node_base *p_Var4;
  __node_base _Var5;
  size_t sVar6;
  __pid_t _Var7;
  int iVar8;
  uint uVar9;
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var10;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var11;
  iterator iVar12;
  ssize_t sVar13;
  _Hash_node_base *p_Var14;
  uint *puVar15;
  uint64_t uVar16;
  undefined4 extraout_var;
  runtime_error *this_00;
  undefined7 in_register_00000009;
  _Hash_node_base _Var17;
  Subprocess *pSVar18;
  int __sig;
  ulong uVar19;
  ulong uVar20;
  pointer __ptr;
  _Hash_node_base *p_Var21;
  _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  Subprocess *__k;
  __node_base _Var22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [12];
  Subprocess sp;
  unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
  write_fd_to_buffer;
  Poll p;
  __buckets_alloc_type __alloc;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  read_fd_to_buffer;
  Subprocess local_168;
  unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
  local_150;
  Poll local_118;
  ulong local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined4 local_d4;
  uint64_t local_d0;
  string local_c8;
  size_t local_a8;
  undefined1 local_a0 [56];
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_d4 = (undefined4)CONCAT71(in_register_00000009,check);
  SubprocessResult::SubprocessResult(__return_storage_ptr__);
  local_d0 = now();
  Subprocess::Subprocess(&local_168,cmd,-1,-1,-1,cwd,env);
  make_fd_nonblocking(local_168.stdin_write_fd);
  make_fd_nonblocking(local_168.stdout_read_fd);
  make_fd_nonblocking(local_168.stderr_read_fd);
  iVar8 = local_168.stdin_write_fd;
  local_150._M_h._M_buckets = &local_150._M_h._M_single_bucket;
  local_150._M_h._M_bucket_count = 1;
  local_150._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_150._M_h._M_element_count = 0;
  local_150._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_150._M_h._M_rehash_policy._M_next_resize = 0;
  local_150._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_118.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (stdin_data == (string *)0x0) {
    close(local_168.stdin_write_fd);
    goto LAB_00116aad;
  }
  p_Var10 = (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)operator_new(0x20);
  __k = (Subprocess *)(long)iVar8;
  p_Var10->_M_buckets = (__buckets_ptr)0x0;
  *(int *)&p_Var10->_M_bucket_count = iVar8;
  (p_Var10->_M_before_begin)._M_nxt = (_Hash_node_base *)stdin_data;
  p_Var10->_M_element_count = 0;
  uVar19 = (ulong)__k % local_150._M_h._M_bucket_count;
  if (local_150._M_h._M_buckets[uVar19] != (_Hash_node_base *)0x0) {
    p_Var21 = local_150._M_h._M_buckets[uVar19]->_M_nxt;
    iVar1 = *(int *)&p_Var21[1]._M_nxt;
    do {
      if (iVar1 == iVar8) {
        operator_delete(p_Var10,0x20);
        goto LAB_00116a9a;
      }
      p_Var21 = p_Var21->_M_nxt;
    } while ((p_Var21 != (_Hash_node_base *)0x0) &&
            (iVar1 = *(int *)&p_Var21[1]._M_nxt,
            (ulong)(long)iVar1 % local_150._M_h._M_bucket_count == uVar19));
  }
  auVar23 = ::std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)&local_150._M_h._M_rehash_policy,local_150._M_h._M_bucket_count,
                       local_150._M_h._M_element_count);
  this_01 = auVar23._8_8_;
  if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (this_01 ==
        (_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)0x1) goto LAB_00116f3b;
    __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                    ((new_allocator<std::__detail::_Hash_node_base_*> *)local_a0,(size_type)this_01,
                     (void *)0x0);
    memset(__s,0,(long)this_01 * 8);
    goto LAB_001169ae;
  }
  do {
    if (local_150._M_h._M_buckets[uVar19] == (_Hash_node_base *)0x0) {
      p_Var10->_M_buckets = (__buckets_ptr)local_150._M_h._M_before_begin._M_nxt;
      if ((_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_150._M_h._M_before_begin._M_nxt !=
          (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)0x0) {
        local_150._M_h._M_buckets
        [(ulong)(long)(int)*(size_type *)(local_150._M_h._M_before_begin._M_nxt + 1) %
         local_150._M_h._M_bucket_count] = (__node_base_ptr)p_Var10;
      }
      local_150._M_h._M_buckets[uVar19] = (__node_base_ptr)&local_150._M_h._M_before_begin;
      local_150._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var10;
    }
    else {
      p_Var10->_M_buckets = &local_150._M_h._M_buckets[uVar19]->_M_nxt->_M_nxt;
      local_150._M_h._M_buckets[uVar19]->_M_nxt = (_Hash_node_base *)p_Var10;
    }
    local_150._M_h._M_element_count = local_150._M_h._M_element_count + 1;
LAB_00116a9a:
    Poll::add(&local_118,local_168.stdin_write_fd,4);
LAB_00116aad:
    local_f8._M_dataplus._M_p._0_4_ = local_168.stdout_read_fd;
    local_a0._0_8_ = __return_storage_ptr__;
    ::std::
    _Hashtable<int,std::pair<int_const,std::__cxx11::string*>,std::allocator<std::pair<int_const,std::__cxx11::string*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<int,std::__cxx11::string*>
              ((_Hashtable<int,std::pair<int_const,std::__cxx11::string*>,std::allocator<std::pair<int_const,std::__cxx11::string*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&local_68);
    Poll::add(&local_118,local_168.stdout_read_fd,1);
    local_f8._M_dataplus._M_p._0_4_ = local_168.stderr_read_fd;
    local_a0._0_8_ = &__return_storage_ptr__->stderr_contents;
    ::std::
    _Hashtable<int,std::pair<int_const,std::__cxx11::string*>,std::allocator<std::pair<int_const,std::__cxx11::string*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<int,std::__cxx11::string*>
              ((_Hashtable<int,std::pair<int_const,std::__cxx11::string*>,std::allocator<std::pair<int_const,std::__cxx11::string*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&local_68);
    Poll::add(&local_118,local_168.stderr_read_fd,1);
    local_100 = 0;
    this_01 = (_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)local_a0;
    p_Var10 = &local_68;
    local_a8 = timeout_usecs;
LAB_00116b56:
    _Var7 = Subprocess::wait(&local_168,(void *)0x1);
    __return_storage_ptr__->exit_status = _Var7;
    if (_Var7 != -1) {
      uVar16 = now();
      __return_storage_ptr__->elapsed_time = uVar16 - __return_storage_ptr__->elapsed_time;
      _Var22._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        if (_Var22._M_nxt == (_Hash_node_base *)0x0) {
          if (((char)local_d4 != '\0') &&
             (_Var7 = Subprocess::wait(&local_168,(void *)0x0), _Var7 != 0)) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            uVar9 = Subprocess::wait(&local_168,(void *)0x0);
            string_printf_abi_cxx11_
                      ((string *)local_a0,"command returned code %d\nstdout:\n%s\nstderr:\n%s",
                       (ulong)uVar9,(__return_storage_ptr__->stdout_contents)._M_dataplus._M_p,
                       (__return_storage_ptr__->stderr_contents)._M_dataplus._M_p);
            ::std::runtime_error::runtime_error(this_00,(string *)local_a0);
            __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          if ((pollfd)local_118.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl
                      .super__Vector_impl_data._M_start != (pollfd)0x0) {
            operator_delete(local_118.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_118.poll_fds.
                                  super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_118.poll_fds.
                                  super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          ::std::
          _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_68);
          _Var5._M_nxt = local_150._M_h._M_before_begin._M_nxt;
          while ((_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)_Var5._M_nxt !=
                 (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)0x0) {
            p_Var10 = (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)((_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)_Var5._M_nxt)->_M_buckets;
            operator_delete(_Var5._M_nxt,0x20);
            _Var5._M_nxt = (_Hash_node_base *)p_Var10;
          }
          memset(local_150._M_h._M_buckets,0,local_150._M_h._M_bucket_count << 3);
          local_150._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_150._M_h._M_element_count = 0;
          if (&local_150._M_h._M_single_bucket != local_150._M_h._M_buckets) {
            operator_delete(local_150._M_h._M_buckets,local_150._M_h._M_bucket_count << 3);
          }
          Subprocess::~Subprocess(&local_168);
          return __return_storage_ptr__;
        }
        while( true ) {
          sVar3 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  _Var22._M_nxt[2]._M_nxt)->_M_string_length;
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var22._M_nxt[2]._M_nxt,sVar3 + 0x20000,'\0');
          sVar13 = ::read(*(int *)&_Var22._M_nxt[1]._M_nxt,
                          (void *)((long)&(_Var22._M_nxt[2]._M_nxt)->_M_nxt->_M_nxt + sVar3),0x20000
                         );
          if (sVar13 < 1) break;
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var22._M_nxt[2]._M_nxt,
                     (sVar13 + ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )_Var22._M_nxt[2]._M_nxt)->_M_string_length) - 0x20000,'\0');
        }
        if (sVar13 < 0) {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var22._M_nxt[2]._M_nxt,sVar3,'\0');
          puVar15 = (uint *)__errno_location();
          if ((*puVar15 != 4) && (*puVar15 != 0xb)) {
            auVar24 = __cxa_allocate_exception(0x10);
            string_for_error_abi_cxx11_((string *)&local_f8,(phosg *)(ulong)*puVar15,auVar24._8_4_);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a0,"read failed: ",&local_f8);
            ::std::runtime_error::runtime_error(auVar24._0_8_,(string *)local_a0);
            __cxa_throw(auVar24._0_8_,&::std::runtime_error::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
        }
        else {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var22._M_nxt[2]._M_nxt,sVar3,'\0');
        }
        _Var22._M_nxt = (_Var22._M_nxt)->_M_nxt;
      } while( true );
    }
    Poll::poll((Poll *)this_01,(pollfd *)&local_118,1000,(int)__return_storage_ptr__);
    p_Var21 = (_Hash_node_base *)local_a0._16_8_;
    while( true ) {
      if (p_Var21 == (_Hash_node_base *)0x0) goto LAB_00116d30;
      __k = (Subprocess *)(p_Var21 + 1);
      if (((ulong)p_Var21[1]._M_nxt & 0x100000000) == 0) goto LAB_00116c33;
      iVar12 = ::std::
               _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(p_Var10,(key_type *)__k);
      if (iVar12.
          super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_false>
          ._M_cur == (__node_type *)0x0) break;
      this = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((long)iVar12.
                     super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_false>
                     ._M_cur + 0x10);
      sVar3 = this->_M_string_length;
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (this,sVar3 + 0x20000,'\0');
      sVar13 = ::read(__k->stdin_write_fd,(this->_M_dataplus)._M_p + sVar3,0x20000);
      if (sVar13 < 1) {
        if (-1 < sVar13) {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    (this,sVar3,'\0');
          Poll::remove(&local_118,(char *)(ulong)(uint)__k->stdin_write_fd);
          ::std::
          _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase(p_Var10,__k);
          goto LAB_00116c33;
        }
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  (this,sVar3,'\0');
        puVar15 = (uint *)__errno_location();
        if ((*puVar15 != 4) && (*puVar15 != 0xb)) {
          auVar24 = __cxa_allocate_exception(0x10);
          string_for_error_abi_cxx11_(&local_c8,(phosg *)(ulong)*puVar15,auVar24._8_4_);
          ::std::operator+(&local_f8,"read failed: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c8);
          ::std::runtime_error::runtime_error(auVar24._0_8_,(string *)&local_f8);
          __cxa_throw(auVar24._0_8_,&::std::runtime_error::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
      }
      else {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  (this,sVar13 + sVar3,'\0');
LAB_00116c33:
        if (((ulong)p_Var21[1]._M_nxt & 0x400000000) != 0) {
          iVar8 = __k->stdin_write_fd;
          if (local_150._M_h._M_buckets[(ulong)(long)iVar8 % local_150._M_h._M_bucket_count] ==
              (_Hash_node_base *)0x0) {
LAB_00116f23:
            ::std::__throw_out_of_range("_Map_base::at");
            break;
          }
          p_Var4 = local_150._M_h._M_buckets[(ulong)(long)iVar8 % local_150._M_h._M_bucket_count]->
                   _M_nxt;
          iVar1 = *(int *)&p_Var4[1]._M_nxt;
          while (iVar1 != iVar8) {
            p_Var4 = p_Var4->_M_nxt;
            if ((p_Var4 == (_Hash_node_base *)0x0) ||
               (iVar1 = *(int *)&p_Var4[1]._M_nxt,
               (ulong)(long)iVar1 % local_150._M_h._M_bucket_count !=
               (ulong)(long)iVar8 % local_150._M_h._M_bucket_count)) goto LAB_00116f23;
          }
          sVar13 = write(iVar8,(void *)((long)&(p_Var4[2]._M_nxt)->_M_nxt->_M_nxt +
                                       (long)&(p_Var4[3]._M_nxt)->_M_nxt),
                         (long)p_Var4[2]._M_nxt[1]._M_nxt - (long)p_Var4[3]._M_nxt);
          if (sVar13 < 1) {
            pSVar18 = __k;
            if (-1 < sVar13) goto LAB_00116cca;
            puVar15 = (uint *)__errno_location();
            if ((*puVar15 != 4) && (*puVar15 != 0xb)) {
              auVar24 = __cxa_allocate_exception(0x10);
              string_for_error_abi_cxx11_(&local_c8,(phosg *)(ulong)*puVar15,auVar24._8_4_);
              ::std::operator+(&local_f8,"write failed: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_c8);
              ::std::runtime_error::runtime_error(auVar24._0_8_,(string *)&local_f8);
              __cxa_throw(auVar24._0_8_,&::std::runtime_error::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
          }
          else {
            p_Var14 = (_Hash_node_base *)((long)&(p_Var4[3]._M_nxt)->_M_nxt + sVar13);
            p_Var4[3]._M_nxt = p_Var14;
            pSVar18 = &local_168;
            if (p_Var14 == p_Var4[2]._M_nxt[1]._M_nxt) {
LAB_00116cca:
              Poll::remove(&local_118,(char *)(ulong)(uint)pSVar18->stdin_write_fd);
              ::std::
              unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
              ::erase(&local_150,(key_type *)(ulong)(uint)__k->stdin_write_fd);
            }
          }
        }
      }
      p_Var21 = p_Var21->_M_nxt;
    }
    ::std::__throw_out_of_range("_Map_base::at");
LAB_00116f3b:
    local_150._M_h._M_single_bucket = (__node_base_ptr)0x0;
    __s = &local_150._M_h._M_single_bucket;
LAB_001169ae:
    _Var17._M_nxt = (_Hash_node_base *)local_150._M_h._M_before_begin._M_nxt;
    local_150._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)_Var17._M_nxt !=
        (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)0x0) {
      uVar19 = 0;
      do {
        p_Var2 = (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(_Var17._M_nxt)->_M_nxt;
        uVar20 = (ulong)(long)(int)*(size_type *)(_Var17._M_nxt + 1) % (ulong)this_01;
        if (__s[uVar20] == (_Hash_node_base *)0x0) {
          (_Var17._M_nxt)->_M_nxt = (_Hash_node_base *)local_150._M_h._M_before_begin._M_nxt;
          local_150._M_h._M_before_begin._M_nxt = (_Hash_node_base *)_Var17._M_nxt;
          __s[uVar20] = (__node_base_ptr)&local_150._M_h._M_before_begin;
          if ((_Var17._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
            pp_Var11 = __s + uVar19;
            goto LAB_00116a07;
          }
        }
        else {
          (_Var17._M_nxt)->_M_nxt = __s[uVar20]->_M_nxt;
          pp_Var11 = &__s[uVar20]->_M_nxt;
          uVar20 = uVar19;
LAB_00116a07:
          *pp_Var11 = _Var17._M_nxt;
        }
        _Var17._M_nxt = (_Hash_node_base *)p_Var2;
        uVar19 = uVar20;
      } while (p_Var2 != (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)0x0);
    }
    if (&local_150._M_h._M_single_bucket != local_150._M_h._M_buckets) {
      operator_delete(local_150._M_h._M_buckets,local_150._M_h._M_bucket_count << 3);
    }
    local_150._M_h._M_bucket_count = (size_type)this_01;
    local_150._M_h._M_buckets = __s;
    uVar19 = (ulong)__k % (ulong)this_01;
  } while( true );
LAB_00116d30:
  std::
  _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(this_01);
  sVar6 = local_a8;
  if (local_a8 == 0) {
    local_a8 = 0;
  }
  else {
    uVar16 = now();
    uVar19 = uVar16 - sVar6;
    if (local_d0 < uVar19) {
      if ((local_100 & 1) == 0) {
        iVar8 = Subprocess::kill(&local_168,0xf,__sig);
        local_100 = CONCAT71((int7)(CONCAT44(extraout_var,iVar8) >> 8),1);
        local_d0 = now();
        local_a8 = 5000000;
      }
      else {
        local_100 = CONCAT71((int7)(uVar19 >> 8),1);
        Subprocess::kill(&local_168,9,__sig);
        local_a8 = sVar6;
      }
    }
  }
  goto LAB_00116b56;
}

Assistant:

SubprocessResult run_process(const vector<string>& cmd, const string* stdin_data,
    bool check, const std::string* cwd,
    const std::unordered_map<std::string, std::string>* env,
    size_t timeout_usecs) {
  SubprocessResult ret;
  bool terminated = false;
  uint64_t start_time = now();

  Subprocess sp(cmd, -1, -1, -1, cwd, env);

  make_fd_nonblocking(sp.stdin_fd());
  make_fd_nonblocking(sp.stdout_fd());
  make_fd_nonblocking(sp.stderr_fd());

  struct Buffer {
    const string* buf;
    size_t offset;
    Buffer(const string* buf) : buf(buf), offset(0) {}
  };
  unordered_map<int, Buffer> write_fd_to_buffer;
  unordered_map<int, string*> read_fd_to_buffer;

  Poll p;
  if (stdin_data) {
    write_fd_to_buffer.emplace(sp.stdin_fd(), stdin_data);
    p.add(sp.stdin_fd(), POLLOUT);
  } else {
    close(sp.stdin_fd());
  }
  read_fd_to_buffer.emplace(sp.stdout_fd(), &ret.stdout_contents);
  p.add(sp.stdout_fd(), POLLIN);
  read_fd_to_buffer.emplace(sp.stderr_fd(), &ret.stderr_contents);
  p.add(sp.stderr_fd(), POLLIN);

  // Read and write to pipes as long as the process is running
  while ((ret.exit_status = sp.wait(true)) == -1) {
    for (const auto& pfd : p.poll(1000)) {
      if (pfd.second & POLLIN) {
        string* buf = read_fd_to_buffer.at(pfd.first);
        size_t read_offset = buf->size();
        buf->resize(read_offset + READ_BLOCK_SIZE);
        ssize_t bytes_read = ::read(pfd.first, buf->data() + read_offset, READ_BLOCK_SIZE);
        if (bytes_read > 0) {
          buf->resize(read_offset + bytes_read);
        } else if (bytes_read < 0) {
          buf->resize(read_offset);
          if (errno == EAGAIN || errno == EINTR || errno == EWOULDBLOCK) {
            continue;
          }
          throw runtime_error("read failed: " + string_for_error(errno));
        } else { // bytes_read == 0; usually means the pipe is broken
          buf->resize(read_offset);
          p.remove(pfd.first, true);
          read_fd_to_buffer.erase(pfd.first);
        }
      }
      if (pfd.second & POLLOUT) {
        auto& buf = write_fd_to_buffer.at(pfd.first);
        size_t bytes_to_write = buf.buf->size() - buf.offset;
        ssize_t bytes_written = write(pfd.first,
            buf.buf->data() + buf.offset, bytes_to_write);
        if (bytes_written > 0) {
          buf.offset += bytes_written;
          if (buf.offset == buf.buf->size()) {
            p.remove(sp.stdin_fd(), true);
            write_fd_to_buffer.erase(pfd.first);
          }
        } else if (bytes_written < 0) {
          if (errno == EAGAIN || errno == EINTR || errno == EWOULDBLOCK) {
            continue;
          }
          throw runtime_error("write failed: " + string_for_error(errno));
        } else { // bytes_written == 0; usually means the pipe is broken
          p.remove(pfd.first, true);
          write_fd_to_buffer.erase(pfd.first);
        }
      }
    }

    if (timeout_usecs && (start_time < now() - timeout_usecs)) {
      if (!terminated) {
        sp.kill(SIGTERM);
        terminated = true;
        timeout_usecs = 5000000;
        start_time = now();
      } else {
        sp.kill(SIGKILL);
      }
    }
  }
  ret.elapsed_time = now() - ret.elapsed_time;

  // Read any leftover data after termination
  for (auto& it : read_fd_to_buffer) {
    for (;;) {
      size_t read_offset = it.second->size();
      it.second->resize(read_offset + READ_BLOCK_SIZE);
      ssize_t bytes_read = ::read(it.first, it.second->data() + read_offset, READ_BLOCK_SIZE);
      if (bytes_read > 0) {
        it.second->resize(it.second->size() - READ_BLOCK_SIZE + bytes_read);
      } else if (bytes_read < 0) {
        it.second->resize(read_offset);
        if (errno == EAGAIN || errno == EINTR || errno == EWOULDBLOCK) {
          break;
        }
        throw runtime_error("read failed: " + string_for_error(errno));
      } else { // bytes_read == 0; usually means the pipe is broken
        it.second->resize(read_offset);
        break;
      }
    }
  }

  if (check && sp.wait()) {
    throw runtime_error(string_printf("command returned code %d\nstdout:\n%s\nstderr:\n%s",
        sp.wait(), ret.stdout_contents.c_str(), ret.stderr_contents.c_str()));
  }

  return ret;
}